

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O1

unit_data units::precise::custom::custom_unit(uint16_t customX)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_0000003a,customX);
  uVar1 = 0x100;
  if (-1 < (char)customX) {
    uVar1 = 0x600;
  }
  return (unit_data)
         ((((uint)(CONCAT62(in_register_0000003a,customX) >> 6) & 0x3ffffff | uVar2 << 0x1e |
           uVar2 << 10) & 0x40008004 | uVar2 << 0x16 & 0x2000000 | (uVar2 & 4) << 0x1a |
           (uVar2 & 2) << 0x1c | uVar1 | (int)(uVar2 << 0x16) >> 0x1f & 0x70U |
           (int)(uVar2 << 0x1b) >> 0x1f & 0x30000U |
          ((int)(uVar2 << 0x19) >> 0x14) + 0x2800U & 0x3800) ^ 0x108007);
}

Assistant:

constexpr detail::unit_data custom_unit(std::uint16_t customX)
        {
            return {
                7 - 4 * bShift(customX, 8U),  // 3 or 7
                -2 + 3 * bShift(customX, 7U),  // -2 or 1
                // 7 or 0  sometimes custom unit/time is used
                7 * bShift(customX, 9U),
                // -3 or -4  this is probably the most important for
                // identifying custom units
                detail::maxNeg(detail::bitwidth::ampere) + 1 -
                    bShift(customX, 6U),
                3 * bShift(customX, 4U),  // 3 or 0
                detail::maxNeg(detail::bitwidth::mole),  // this also is set so
                                                         // that 1/-2 = -2 for a
                                                         // 2 bit signed number
                -2 + 2 * bShift(customX, 5U),
                -2 * bShift(customX, 3U),
                0,
                0,
                bShiftu(customX, 2U),
                bShiftu(customX, 1U),
                bShiftu(customX, 0U),
                0};
        }